

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar *puVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  code *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  unsigned_long _zzq_result_1;
  int is_nonce_valid;
  unsigned_long _zzq_args [6];
  uchar nonce32 [32];
  secp256k1_scalar msg;
  secp256k1_scalar non;
  undefined1 local_15c [20];
  uchar *local_148;
  uint local_13c;
  undefined8 local_138;
  secp256k1_scalar *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  void *local_108;
  secp256k1_ecdsa_signature *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  secp256k1_scalar local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_b8._8_8_ = local_b8._0_8_;
  local_148 = msghash32;
  local_108 = noncedata;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_sign_cold_5();
  }
  else if ((ctx->ecmult_gen_ctx).built != 0) {
    if (msghash32 == (uchar *)0x0) {
      secp256k1_ecdsa_sign_cold_3();
      return 0;
    }
    if (signature == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_sign_cold_2();
      return 0;
    }
    if (seckey == (uchar *)0x0) {
      secp256k1_ecdsa_sign_cold_1();
      return 0;
    }
    local_58 = ZEXT816(0);
    local_48 = ZEXT816(0);
    local_78 = ZEXT816(0);
    local_68 = ZEXT816(0);
    pcVar9 = nonce_function_rfc6979;
    if (noncefp != (secp256k1_nonce_function)0x0) {
      pcVar9 = noncefp;
    }
    local_100 = signature;
    local_13c = secp256k1_scalar_set_b32_seckey(&local_98,seckey);
    local_d8._0_4_ = local_13c ^ 1;
    secp256k1_scalar_verify(&secp256k1_scalar_one);
    local_138 = 0x4d430005;
    local_128 = 0x20;
    uVar6 = 0;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_b8._8_8_;
    local_b8 = auVar3 << 0x40;
    uVar1 = (long)(int)local_d8._0_4_ - 1;
    local_98.d[0] = (ulong)(local_d8._0_4_ & 1) | local_98.d[0] & uVar1;
    auVar2._8_8_ = local_98.d[2];
    auVar2._0_8_ = local_98.d[1];
    auVar12._8_4_ = (int)uVar1;
    auVar12._0_8_ = uVar1;
    auVar12._12_4_ = (int)(uVar1 >> 0x20);
    local_98.d[1] = SUB168(auVar12 & auVar2,0);
    local_98.d[2] = SUB168(auVar12 & auVar2,8);
    local_98.d[3] = local_98.d[3] & uVar1;
    local_130 = &local_98;
    secp256k1_scalar_verify(&local_98);
    puVar4 = local_148;
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_d8,local_148,(int *)0x0);
    iVar5 = (*pcVar9)(local_f8,puVar4,seckey,(uchar *)0x0,local_108,0);
    local_15c[0] = iVar5 != 0;
    if ((bool)local_15c[0]) {
      uVar8 = 1;
      do {
        local_15c._1_3_ = 0;
        local_15c._16_4_ = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)local_b8,local_f8);
        if (ctx->declassify != 0) {
          local_138 = 0x4d430002;
          local_130 = (secp256k1_scalar *)(local_15c + 0x10);
          local_128 = 4;
          local_120 = 0;
          local_118 = 0;
          local_110 = 0;
          local_15c._4_8_ = 0;
        }
        if (local_15c._16_4_ != 0) {
          uVar6 = secp256k1_ecdsa_sig_sign
                            (&ctx->ecmult_gen_ctx,(secp256k1_scalar *)local_58,
                             (secp256k1_scalar *)local_78,&local_98,(secp256k1_scalar *)local_d8,
                             (secp256k1_scalar *)local_b8,(int *)0x0);
          if (ctx->declassify != 0) {
            local_138 = 0x4d430002;
            local_130 = (secp256k1_scalar *)local_15c;
            local_128 = 4;
            local_120 = 0;
            local_118 = 0;
            local_110 = 0;
            local_15c._4_8_ = 0;
          }
          local_15c._0_4_ = uVar6;
          if (uVar6 != 0) break;
        }
        uVar6 = 0;
        iVar5 = (*pcVar9)(local_f8,local_148,seckey,(uchar *)0x0,local_108,uVar8);
        uVar8 = uVar8 + 1;
        local_15c[0] = iVar5 != 0;
      } while ((bool)local_15c[0]);
    }
    local_15c._0_4_ = uVar6 & local_13c;
    local_f8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_98.d[0] = 0;
    local_98.d[1] = 0;
    local_98.d[2] = 0;
    local_98.d[3] = 0;
    local_130 = &local_98;
    local_138 = 0x4d430001;
    local_128 = 0x20;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    local_15c._4_8_ = 0;
    local_15c._16_4_ = ZEXT14(local_15c._0_4_ == 0);
    secp256k1_scalar_verify(&secp256k1_scalar_zero);
    local_138 = 0x4d430005;
    local_130 = (secp256k1_scalar *)local_58;
    local_128 = 0x20;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    local_15c._4_8_ = 0;
    lVar7 = (long)(int)local_15c._16_4_ + -1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    local_58 = local_58 & auVar10;
    local_48 = auVar10 & local_48;
    secp256k1_scalar_verify(local_130);
    local_15c._16_4_ = ZEXT14(local_15c._0_4_ == 0);
    secp256k1_scalar_verify(&secp256k1_scalar_zero);
    local_138 = 0x4d430005;
    local_130 = (secp256k1_scalar *)local_78;
    local_128 = 0x20;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    local_15c._4_8_ = 0;
    lVar7 = (long)(int)local_15c._16_4_ + -1;
    auVar11._8_4_ = (int)lVar7;
    auVar11._0_8_ = lVar7;
    auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
    local_78 = local_78 & auVar11;
    local_68 = auVar11 & local_68;
    secp256k1_scalar_verify(local_130);
    *(undefined8 *)(local_100->data + 0x10) = local_48._0_8_;
    *(undefined8 *)(local_100->data + 0x18) = local_48._8_8_;
    *(undefined8 *)local_100->data = local_58._0_8_;
    *(undefined8 *)(local_100->data + 8) = local_58._8_8_;
    *(undefined8 *)(local_100->data + 0x20) = local_78._0_8_;
    *(undefined8 *)(local_100->data + 0x28) = local_78._8_8_;
    *(undefined8 *)(local_100->data + 0x30) = local_68._0_8_;
    *(undefined8 *)(local_100->data + 0x38) = local_68._8_8_;
    return local_15c._0_4_;
  }
  secp256k1_ecdsa_sign_cold_4();
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}